

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*>::
emplace<QSortFilterProxyModelPrivate::Mapping*const&>
          (QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*> *this,
          QModelIndexWrapper *key,Mapping **args)

{
  Mapping *pMVar1;
  Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
  *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pMVar1 = *(Mapping **)this;
  if (pMVar1 == (Mapping *)0x0) {
LAB_00494f26:
    pDVar2 = *(Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
               **)this;
    local_28.d = (Data *)pMVar1;
    if ((pDVar2 == (Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
                    *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::
               Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
               ::detached(pDVar2);
      *(Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
        **)this = pDVar2;
    }
    pVar3 = (piter)emplace_helper<QSortFilterProxyModelPrivate::Mapping*const&>(this,key,args);
    QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::~QHash(&local_28)
    ;
  }
  else {
    if (1 < *(uint *)&(pMVar1->source_rows).d.d) {
      if ((pMVar1 != (Mapping *)0x0) && (*(int *)&(pMVar1->source_rows).d.d != -1)) {
        LOCK();
        *(int *)&(pMVar1->source_rows).d.d = *(int *)&(pMVar1->source_rows).d.d + 1;
        UNLOCK();
      }
      goto LAB_00494f26;
    }
    if ((pMVar1->source_rows).d.ptr < (int *)((ulong)(pMVar1->source_rows).d.size >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QSortFilterProxyModelPrivate::Mapping*const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_00494fbc;
    }
    local_28.d = (Data *)*args;
    pVar3 = (piter)emplace_helper<QSortFilterProxyModelPrivate::Mapping*>
                             (this,key,(Mapping **)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_00494fbc:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }